

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uTimer.cpp
# Opt level: O1

void __thiscall UTimer::~UTimer(UTimer *this)

{
  pointer pcVar1;
  long lVar2;
  ostream *poVar3;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  (this->stop).__d.__r = lVar2;
  (this->elapsedTime).__r = (double)(lVar2 - (this->start).__d.__r) / 1000000000.0;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->message)._M_dataplus._M_p,
                      (this->message)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," computed in ",0xd);
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," usec  (",8);
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," milliseconds)",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  pcVar1 = (this->message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->message).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

UTimer::~UTimer () {
	stop		= std::chrono::high_resolution_clock::now();
	elapsedTime	= stop - start;
	auto usec	= std::chrono::duration_cast<usecs>(elapsedTime).count();
	auto msec	= std::chrono::duration_cast<msecs>(elapsedTime).count();
	
	std::cout << message << " computed in " << usec << " usec  (" << msec << " milliseconds)" << std::endl;
}